

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testProcrustes.cpp
# Opt level: O0

void testWithTranslateRotateAndScale<float>(M44d *m)

{
  ulong uVar1;
  ostream *poVar2;
  size_type sVar3;
  reference pvVar4;
  reference pvVar5;
  reference pvVar6;
  value_type *pvVar7;
  float fVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  size_t i_2;
  size_t i_1;
  M44d res;
  size_t i;
  vector<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_> to;
  size_t numPoints;
  float eps;
  vector<float,_std::allocator<float>_> weights;
  vector<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_> from;
  Rand48 rand;
  value_type *in_stack_fffffffffffffd68;
  Vec3<float> *in_stack_fffffffffffffd70;
  Vec3<float> *in_stack_fffffffffffffd78;
  reference in_stack_fffffffffffffd80;
  reference in_stack_fffffffffffffd88;
  value_type *local_1c8;
  Vec3 local_1c0 [104];
  Matrix44<double> *in_stack_fffffffffffffea8;
  ostream *in_stack_fffffffffffffeb0;
  ulong local_128;
  Matrix44<double> local_120;
  ulong local_90;
  vector<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_> local_88;
  float local_70;
  Vec3<float> local_6c;
  ulong local_60;
  undefined4 local_44;
  vector<float,_std::allocator<float>_> local_40;
  vector<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_> local_28;
  
  std::operator<<((ostream *)&std::cout,"Testing with known translate/rotate/scale matrix\n");
  Imath_3_2::operator<<(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  Imath_3_2::Rand48::Rand48
            ((Rand48 *)in_stack_fffffffffffffd70,(unsigned_long)in_stack_fffffffffffffd68);
  std::vector<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>::vector
            ((vector<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_> *)0x18f629);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)0x18f636);
  local_44 = 0x38d1b717;
  poVar2 = std::operator<<((ostream *)&std::cout,"numPoints: ");
  std::ostream::operator<<(poVar2,std::flush<char,std::char_traits<char>>);
  local_60 = 1;
  do {
    if (9 < local_60) {
      std::operator<<((ostream *)&std::cout,"  OK\n");
      std::vector<float,_std::allocator<float>_>::~vector
                ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffd80);
      std::vector<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>::~vector
                ((vector<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_> *)
                 in_stack_fffffffffffffd80);
      return;
    }
    dVar9 = Imath_3_2::Rand48::nextf((Rand48 *)0x18f69d);
    dVar10 = Imath_3_2::Rand48::nextf((Rand48 *)0x18f6cb);
    dVar11 = Imath_3_2::Rand48::nextf((Rand48 *)0x18f6f9);
    Imath_3_2::Vec3<float>::Vec3(&local_6c,(float)dVar9,(float)dVar10,(float)dVar11);
    std::vector<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>::push_back
              ((vector<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_> *)
               in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
    dVar9 = Imath_3_2::Rand48::nextf((Rand48 *)0x18f756);
    local_70 = (float)dVar9;
    std::vector<float,_std::allocator<float>_>::push_back
              ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffffd70,
               &in_stack_fffffffffffffd68->x);
    sVar3 = std::vector<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>::size
                      (&local_28);
    poVar2 = (ostream *)std::ostream::operator<<(&std::cout,sVar3);
    std::operator<<(poVar2," ");
    std::vector<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>::vector
              ((vector<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_> *)0x18f7cb)
    ;
    local_90 = 0;
    while( true ) {
      uVar1 = local_90;
      sVar3 = std::vector<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>::size
                        (&local_28);
      if (sVar3 <= uVar1) break;
      std::vector<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>::operator[]
                (&local_28,local_90);
      Imath_3_2::operator*(in_stack_fffffffffffffd88,(Matrix44<double> *)in_stack_fffffffffffffd80);
      std::vector<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>::push_back
                ((vector<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_> *)
                 in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
      local_90 = local_90 + 1;
    }
    pvVar4 = std::vector<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>::
             operator[](&local_28,0);
    pvVar5 = std::vector<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>::
             operator[](&local_88,0);
    pvVar6 = std::vector<float,_std::allocator<float>_>::operator[](&local_40,0);
    sVar3 = std::vector<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>::size
                      (&local_28);
    Imath_3_2::procrustesRotationAndTranslation<float>
              ((Vec3 *)&local_120,(Vec3 *)pvVar4,&pvVar5->x,(ulong)pvVar6,SUB81(sVar3,0));
    local_128 = 0;
    while( true ) {
      sVar3 = std::vector<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>::size
                        (&local_28);
      if (sVar3 <= local_128) break;
      std::vector<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>::operator[]
                (&local_28,local_128);
      Imath_3_2::operator*(in_stack_fffffffffffffd88,(Matrix44<double> *)in_stack_fffffffffffffd80);
      std::vector<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>::operator[]
                (&local_88,local_128);
      Imath_3_2::Vec3<float>::operator-(in_stack_fffffffffffffd78,in_stack_fffffffffffffd70);
      fVar8 = Imath_3_2::Vec3<float>::length(in_stack_fffffffffffffd78);
      if (0.0001 <= fVar8) {
        __assert_fail("(from[i] * res - to[i]).length () < eps",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testProcrustes.cpp"
                      ,0x62,
                      "void testWithTranslateRotateAndScale(const Imath_3_2::M44d &) [T = float]");
      }
      local_128 = local_128 + 1;
    }
    in_stack_fffffffffffffd70 = (Vec3<float> *)0x0;
    in_stack_fffffffffffffd78 = (Vec3<float> *)&local_28;
    in_stack_fffffffffffffd80 =
         std::vector<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>::operator[]
                   ((vector<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_> *)
                    in_stack_fffffffffffffd78,0);
    in_stack_fffffffffffffd88 =
         std::vector<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>::operator[]
                   (&local_88,(size_type)in_stack_fffffffffffffd70);
    sVar3 = std::vector<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>::size
                      ((vector<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_> *)
                       in_stack_fffffffffffffd78);
    Imath_3_2::procrustesRotationAndTranslation<float>
              (local_1c0,(Vec3 *)in_stack_fffffffffffffd80,(ulong)in_stack_fffffffffffffd88,
               SUB81(sVar3,0));
    Imath_3_2::Matrix44<double>::operator=(&local_120,(Matrix44<double> *)local_1c0);
    local_1c8 = (value_type *)0x0;
    while( true ) {
      in_stack_fffffffffffffd68 = local_1c8;
      pvVar7 = (value_type *)
               std::vector<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>::size
                         (&local_28);
      if (pvVar7 <= in_stack_fffffffffffffd68) break;
      std::vector<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>::operator[]
                (&local_28,(size_type)local_1c8);
      Imath_3_2::operator*(in_stack_fffffffffffffd88,(Matrix44<double> *)in_stack_fffffffffffffd80);
      std::vector<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>::operator[]
                (&local_88,(size_type)local_1c8);
      Imath_3_2::Vec3<float>::operator-(in_stack_fffffffffffffd78,in_stack_fffffffffffffd70);
      fVar8 = Imath_3_2::Vec3<float>::length(in_stack_fffffffffffffd78);
      if (0.0001 <= fVar8) {
        __assert_fail("(from[i] * res - to[i]).length () < eps",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testProcrustes.cpp"
                      ,0x68,
                      "void testWithTranslateRotateAndScale(const Imath_3_2::M44d &) [T = float]");
      }
      local_1c8 = (value_type *)((long)&local_1c8->x + 1);
    }
    std::vector<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_>::~vector
              ((vector<Imath_3_2::Vec3<float>,_std::allocator<Imath_3_2::Vec3<float>_>_> *)
               in_stack_fffffffffffffd80);
    local_60 = local_60 + 1;
  } while( true );
}

Assistant:

void
testWithTranslateRotateAndScale (const IMATH_INTERNAL_NAMESPACE::M44d& m)
{
    std::cout << "Testing with known translate/rotate/scale matrix\n" << m;
    IMATH_INTERNAL_NAMESPACE::Rand48 rand (5376);

    typedef IMATH_INTERNAL_NAMESPACE::Vec3<T> V3;
    std::vector<V3>                           from;
    std::vector<T>                            weights;

    const float eps = 1e-4f;
    std::cout << "numPoints: " << std::flush;
    for (size_t numPoints = 1; numPoints < 10; ++numPoints)
    {
        from.push_back (V3(
            static_cast<T>(rand.nextf()),
            static_cast<T>(rand.nextf()),
            static_cast<T>(rand.nextf())));
        weights.push_back(static_cast<T>(rand.nextf()));
        std::cout << from.size () << " ";

        std::vector<V3> to;
        for (size_t i = 0; i < from.size (); ++i)
            to.push_back (from[i] * m);

        // weighted:
        IMATH_INTERNAL_NAMESPACE::M44d res =
            IMATH_INTERNAL_NAMESPACE::procrustesRotationAndTranslation (
                &from[0], &to[0], &weights[0], from.size (), true);
        for (size_t i = 0; i < from.size (); ++i)
            assert ((from[i] * res - to[i]).length () < eps);

        // unweighted:
        res = IMATH_INTERNAL_NAMESPACE::procrustesRotationAndTranslation (
            &from[0], &to[0], from.size (), true);
        for (size_t i = 0; i < from.size (); ++i)
            assert ((from[i] * res - to[i]).length () < eps);
    }
    std::cout << "  OK\n";
}